

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

ostream * CMU462::operator<<(ostream *os,Matrix3x3 *A)

{
  double *pdVar1;
  ostream *poVar2;
  int local_20;
  int local_1c;
  int j;
  int i;
  Matrix3x3 *A_local;
  ostream *os_local;
  
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    std::operator<<(os,"[ ");
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pdVar1 = Matrix3x3::operator()(A,local_1c,local_20);
      poVar2 = (ostream *)std::ostream::operator<<(os,*pdVar1);
      std::operator<<(poVar2," ");
    }
    poVar2 = std::operator<<(os,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Matrix3x3& A ) {
    for( int i = 0; i < 3; i++ )
    {
       os << "[ ";

       for( int j = 0; j < 3; j++ )
       {
          os << A(i,j) << " ";
       }

       os << "]" << std::endl;
    }

    return os;
  }